

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaK_infix(FuncState *fs,BinOpr op,expdesc *v)

{
  int iVar1;
  expdesc *v_local;
  BinOpr op_local;
  FuncState *fs_local;
  
  switch(op) {
  case OPR_ADD:
  case OPR_SUB:
  case OPR_MUL:
  case OPR_DIV:
  case OPR_MOD:
  case OPR_POW:
    iVar1 = isnumeral(v);
    if (iVar1 == 0) {
      luaK_exp2RK(fs,v);
    }
    break;
  case OPR_CONCAT:
    luaK_exp2nextreg(fs,v);
    break;
  default:
    luaK_exp2RK(fs,v);
    break;
  case OPR_AND:
    luaK_goiftrue(fs,v);
    break;
  case OPR_OR:
    luaK_goiffalse(fs,v);
  }
  return;
}

Assistant:

static void luaK_infix(FuncState*fs,BinOpr op,expdesc*v){
switch(op){
case OPR_AND:{
luaK_goiftrue(fs,v);
break;
}
case OPR_OR:{
luaK_goiffalse(fs,v);
break;
}
case OPR_CONCAT:{
luaK_exp2nextreg(fs,v);
break;
}
case OPR_ADD:case OPR_SUB:case OPR_MUL:case OPR_DIV:
case OPR_MOD:case OPR_POW:{
if(!isnumeral(v))luaK_exp2RK(fs,v);
break;
}
default:{
luaK_exp2RK(fs,v);
break;
}
}
}